

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Init(sqlite3 *db,char **pzErrMsg)

{
  uint uVar1;
  bool bVar2;
  int local_20;
  int commit_internal;
  int rc;
  int i;
  char **pzErrMsg_local;
  sqlite3 *db_local;
  
  uVar1 = db->flags;
  local_20 = 0;
  (db->init).busy = '\x01';
  db->enc = db->aDb->pSchema->enc;
  commit_internal = 0;
  while( true ) {
    bVar2 = false;
    if (local_20 == 0) {
      bVar2 = commit_internal < db->nDb;
    }
    if (!bVar2) break;
    if (((((db->aDb[commit_internal].pSchema)->schemaFlags & 1) != 1) && (commit_internal != 1)) &&
       (local_20 = sqlite3InitOne(db,commit_internal,pzErrMsg), local_20 != 0)) {
      sqlite3ResetOneSchema(db,commit_internal);
    }
    commit_internal = commit_internal + 1;
  }
  if (((local_20 == 0) && (((db->aDb[1].pSchema)->schemaFlags & 1) != 1)) &&
     (local_20 = sqlite3InitOne(db,1,pzErrMsg), local_20 != 0)) {
    sqlite3ResetOneSchema(db,1);
  }
  (db->init).busy = '\0';
  if ((local_20 == 0) && ((uVar1 & 0x800000) == 0)) {
    sqlite3CommitInternalChanges(db);
  }
  return local_20;
}

Assistant:

SQLITE_PRIVATE int sqlite3Init(sqlite3 *db, char **pzErrMsg){
  int i, rc;
  int commit_internal = !(db->flags&SQLITE_InternChanges);
  
  assert( sqlite3_mutex_held(db->mutex) );
  assert( sqlite3BtreeHoldsMutex(db->aDb[0].pBt) );
  assert( db->init.busy==0 );
  rc = SQLITE_OK;
  db->init.busy = 1;
  ENC(db) = SCHEMA_ENC(db);
  for(i=0; rc==SQLITE_OK && i<db->nDb; i++){
    if( DbHasProperty(db, i, DB_SchemaLoaded) || i==1 ) continue;
    rc = sqlite3InitOne(db, i, pzErrMsg);
    if( rc ){
      sqlite3ResetOneSchema(db, i);
    }
  }

  /* Once all the other databases have been initialized, load the schema
  ** for the TEMP database. This is loaded last, as the TEMP database
  ** schema may contain references to objects in other databases.
  */
#ifndef SQLITE_OMIT_TEMPDB
  assert( db->nDb>1 );
  if( rc==SQLITE_OK && !DbHasProperty(db, 1, DB_SchemaLoaded) ){
    rc = sqlite3InitOne(db, 1, pzErrMsg);
    if( rc ){
      sqlite3ResetOneSchema(db, 1);
    }
  }
#endif

  db->init.busy = 0;
  if( rc==SQLITE_OK && commit_internal ){
    sqlite3CommitInternalChanges(db);
  }

  return rc; 
}